

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.h
# Opt level: O0

void __thiscall uWS::HttpContext<false>::free(HttpContext<false> *this,void *__ptr)

{
  HttpContextData<false> *this_00;
  us_socket_context_t *puVar1;
  HttpContextData<false> *httpContextData;
  
  this_00 = getSocketContextData((HttpContext<false> *)0x23b2c7);
  HttpContextData<false>::~HttpContextData(this_00);
  puVar1 = getSocketContext(this);
  us_socket_context_free(0,puVar1);
  return;
}

Assistant:

void free() {
        /* Destruct socket context data */
        HttpContextData<SSL> *httpContextData = getSocketContextData();
        httpContextData->~HttpContextData<SSL>();

        /* Free the socket context in whole */
        us_socket_context_free(SSL, getSocketContext());
    }